

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O0

JL_STATUS ParseForList(ParseParameters *Params,size_t *pErrorAtPos)

{
  char local_29;
  ParseStack *pPStack_28;
  char nextChar;
  ParseStack *currentStack;
  size_t *psStack_18;
  JL_STATUS jlStatus;
  size_t *pErrorAtPos_local;
  ParseParameters *Params_local;
  
  pPStack_28 = Params->Stack + Params->StackIndex;
  if ((pPStack_28->ProcessedFirstItem & 1U) == 0) {
    Params->StringIndex = Params->StringIndex + 1;
  }
  psStack_18 = pErrorAtPos;
  pErrorAtPos_local = (size_t *)Params;
  currentStack._4_4_ = SkipWhiteSpace(Params,&local_29);
  if (currentStack._4_4_ == JL_STATUS_SUCCESS) {
    if ((pPStack_28->PrevScanComma & 1U) == 0) {
      if (local_29 == ']') {
        pPStack_28->FinishedProcessing = true;
        pErrorAtPos_local[4] = pErrorAtPos_local[4] + 1;
      }
      else if (local_29 == ',') {
        if ((pPStack_28->ProcessedFirstItem & 1U) == 0) {
          currentStack._4_4_ = JL_STATUS_INVALID_DATA;
        }
        else {
          pErrorAtPos_local[4] = pErrorAtPos_local[4] + 1;
          pPStack_28->PrevScanComma = true;
        }
      }
      else if ((pPStack_28->ProcessedFirstItem & 1U) == 0) {
        pPStack_28->ScanForSubObjects = true;
      }
      else {
        currentStack._4_4_ = JL_STATUS_INVALID_DATA;
      }
    }
    else if ((local_29 == ',') || ((local_29 == ']' && ((pErrorAtPos_local[5] & 1) == 0)))) {
      currentStack._4_4_ = JL_STATUS_INVALID_DATA;
    }
    else if ((local_29 == ']') && ((pErrorAtPos_local[5] & 1) != 0)) {
      pPStack_28->FinishedProcessing = true;
      pErrorAtPos_local[4] = pErrorAtPos_local[4] + 1;
    }
    else {
      pPStack_28->ScanForSubObjects = true;
      pPStack_28->PrevScanComma = false;
    }
    pPStack_28->ProcessedFirstItem = true;
  }
  if (((currentStack._4_4_ != JL_STATUS_SUCCESS) && (psStack_18 != (size_t *)0x0)) &&
     (*psStack_18 == 0)) {
    *psStack_18 = pErrorAtPos_local[4];
  }
  return currentStack._4_4_;
}

Assistant:

static
JL_STATUS
    ParseForList
    (
        ParseParameters*    Params,
        size_t*             pErrorAtPos     // OPTIONAL
    )
{
    JL_STATUS jlStatus;
    ParseStack* currentStack = &Params->Stack[Params->StackIndex];
    char nextChar;

    if( !currentStack->ProcessedFirstItem )
    {
        // Skip past opening square bracket
        Params->StringIndex += 1;
    }

    jlStatus = SkipWhiteSpace( Params, &nextChar );
    if( JL_STATUS_SUCCESS == jlStatus )
    {
        if( !currentStack->PrevScanComma )
        {
            if( ']' == nextChar )
            {
                // End of array
                currentStack->FinishedProcessing = true;
                Params->StringIndex += 1;
            }
            else if( ',' == nextChar )
            {
                if( ! currentStack->ProcessedFirstItem )
                {
                    // Should not be a comma before first item
                    jlStatus = JL_STATUS_INVALID_DATA;
                }
                else
                {
                    Params->StringIndex += 1;
                    currentStack->PrevScanComma = true;
                }
            }
            else
            {
                if( currentStack->ProcessedFirstItem )
                {
                    // After first item we need to have a comma or a end bracket after
                    // the data.
                    jlStatus = JL_STATUS_INVALID_DATA;
                }
                else
                {
                    currentStack->ScanForSubObjects = true;
                }
            }
        }
        else
        {
            // If in last scan we had a comma then we must not have a comma again or an end bracket unless
            // its Json5
            if(     ',' == nextChar
                ||  ( ']' == nextChar && !Params->IsJson5 ) )
            {
                jlStatus = JL_STATUS_INVALID_DATA;
            }
            else if( ']' == nextChar && Params->IsJson5 )
            {
                // Allowed an end bracket after a trailing comma in Json5
                currentStack->FinishedProcessing = true;
                Params->StringIndex += 1;
            }
            else
            {
                currentStack->ScanForSubObjects = true;
                currentStack->PrevScanComma = false;
            }
        }

        currentStack->ProcessedFirstItem = true;
    }

    if(     JL_STATUS_SUCCESS != jlStatus
        &&  NULL != pErrorAtPos
        &&  0 == *pErrorAtPos )
    {
        *pErrorAtPos = Params->StringIndex;
    }

    return jlStatus;
}